

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

uchar * __thiscall
cimg_library::CImg<unsigned_char>::max_min<float>(CImg<unsigned_char> *this,float *min_val)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  CImgInstanceException *this_00;
  byte bVar4;
  uchar *ptrs;
  byte *pbVar5;
  byte *pbVar6;
  byte bVar7;
  char *pcVar8;
  
  bVar2 = is_empty(this);
  if (bVar2) {
    this_00 = (CImgInstanceException *)__cxa_allocate_exception(0x10);
    pcVar8 = "non-";
    if (this->_is_shared != false) {
      pcVar8 = "";
    }
    CImgInstanceException::CImgInstanceException
              (this_00,"[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::max_min(): Empty instance.",
               (ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar8,"unsigned char");
    __cxa_throw(this_00,&CImgInstanceException::typeinfo,CImgException::~CImgException);
  }
  pbVar3 = this->_data;
  bVar4 = *pbVar3;
  pbVar6 = pbVar3 + (ulong)this->_spectrum * (ulong)this->_depth *
                    (ulong)this->_height * (ulong)this->_width;
  bVar7 = bVar4;
  for (pbVar5 = pbVar3; pbVar5 < pbVar6; pbVar5 = pbVar5 + 1) {
    bVar1 = *pbVar5;
    if (bVar7 < bVar1) {
      pbVar3 = pbVar5;
      bVar7 = bVar1;
    }
    if (bVar1 < bVar4) {
      bVar4 = bVar1;
    }
  }
  *min_val = (float)bVar4;
  return pbVar3;
}

Assistant:

const T& max_min(t& min_val) const {
      if (is_empty())
        throw CImgInstanceException(_cimg_instance
                                    "max_min(): Empty instance.",
                                    cimg_instance);
      const T *ptr_max = _data;
      T max_value = *ptr_max, min_value = max_value;
      cimg_for(*this,ptrs,T) {
        const T val = *ptrs;
        if (val>max_value) { max_value = val; ptr_max = ptrs; }
        if (val<min_value) min_value = val;
      }
      min_val = (t)min_value;
      return *ptr_max;
    }